

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

bool DivisionCornerCaseHelper<char,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long_long lhs,
               SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  
  if (rhs.m_int < '\x01') {
    if (rhs.m_int == '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)(byte)~rhs.m_int + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lhs;
    uVar4 = SUB168(auVar2 / auVar1,0);
    if (uVar4 < 0x80) {
      uVar3 = (ulong)(byte)-SUB161(auVar2 / auVar1,0);
    }
    else {
      uVar3 = 0x80;
      if (uVar4 != 0x80) goto LAB_0010d133;
    }
  }
  else {
    uVar3 = lhs / (byte)rhs.m_int;
    if (0x7f < uVar3) {
LAB_0010d133:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  result->m_int = (char)uVar3;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }